

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
          (polymorphic_allocator<std::byte> *this,TriangleMesh *p,Transform *args,bool *args_1,
          vector<int,_std::allocator<int>_> *args_2,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_3,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *args_4,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *args_5,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *args_6,
          vector<int,_std::allocator<int>_> *args_7)

{
  bool reverseOrientation;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  undefined8 uVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  undefined8 in_stack_ffffffffffffff40;
  pointer in_stack_ffffffffffffff48;
  pointer local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  pointer local_88;
  pointer piStack_80;
  pointer local_78;
  pointer local_68;
  pointer pPStack_60;
  pointer local_58;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> local_50;
  
  reverseOrientation = *args_1;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,args_2);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             &stack0xffffffffffffff48,args_3);
  pVVar2 = (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pVVar4 = (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = 0x28efcb;
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::vector
            (&local_50,args_5);
  local_68 = (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pPStack_60 = (args_6->
               super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  local_58 = (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
  piStack_80 = (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
  local_78 = (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_68;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_50;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_88;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pVVar2;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)uVar1;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pVVar3;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffff40;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pVVar4;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffff48;
  pbrt::TriangleMesh::TriangleMesh
            (p,args,reverseOrientation,&local_a0,
             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             &stack0xffffffffffffff48,
             (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
             &stack0xffffffffffffff28,n,uv,faceIndices);
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_50.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)pVVar4 - (long)pVVar2);
  }
  if (in_stack_ffffffffffffff48 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffff48,(long)local_a8 - (long)in_stack_ffffffffffffff48);
  }
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }